

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWIAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall AtmelSWIAnalyzerSettings::SetSettingsFromInterfaces(AtmelSWIAnalyzerSettings *this)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  Channel local_58 [32];
  Channel local_38 [16];
  Channel local_28 [16];
  AtmelSWIAnalyzerSettings *local_18;
  AtmelSWIAnalyzerSettings *this_local;
  
  local_18 = this;
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator==(local_28,local_38);
  Channel::~Channel(local_38);
  Channel::~Channel(local_28);
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    AnalyzerSettings::SetErrorText((char *)this);
  }
  else {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::operator=(&this->mSDAChannel,local_58);
    Channel::~Channel(local_58);
    dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mDecodeLevel = (int)dVar3;
    AnalyzerSettings::ClearChannels();
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSDAChannel,true);
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool AtmelSWIAnalyzerSettings::SetSettingsFromInterfaces()
{
    if( mSDAChannelInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the SDA channel." );
        return false;
    }

    mSDAChannel = mSDAChannelInterface.GetChannel();
    mDecodeLevel = static_cast<DecodeLevel>( static_cast<int>( mDecodeLevelInterface.GetNumber() ) );

    ClearChannels();

    AddChannel( mSDAChannel, CHANNEL_NAME, true );

    return true;
}